

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void desc_obj_fake(wchar_t k_idx)

{
  object_kind *kind;
  object_kind *kind_00;
  object_kind *poVar1;
  textblock *tb;
  object *obj;
  object *known_obj;
  char header [120];
  object *local_c0;
  object *local_b8;
  object *local_b0;
  char local_a8 [120];
  
  poVar1 = k_info;
  kind = k_info + k_idx;
  local_b0 = player->upkeep->object;
  kind_00 = player->upkeep->object_kind;
  local_c0 = object_new();
  local_b8 = object_new();
  track_object_kind(player->upkeep,kind);
  handle_stuff(player);
  object_prep(local_c0,kind,L'\0',EXTREMIFY);
  if ((poVar1[k_idx].aware != false) || (kind->flavor == (flavor *)0x0)) {
    object_copy(local_b8,local_c0);
  }
  local_c0->known = local_b8;
  handle_stuff(player);
  tb = object_info(local_c0,OINFO_FAKE);
  object_desc(local_a8,0x78,local_c0,0xc0,player);
  textui_textblock_show(tb,(region)ZEXT816(0),local_a8);
  object_delete((chunk *)0x0,(chunk *)0x0,&local_b8);
  object_delete((chunk *)0x0,(chunk *)0x0,&local_c0);
  textblock_free(tb);
  if (kind_00 == (object_kind *)0x0) {
    if (local_b0 == (object *)0x0) {
      track_object_cancel(player->upkeep);
    }
    else {
      track_object(player->upkeep,local_b0);
    }
  }
  else {
    track_object_kind(player->upkeep,kind_00);
  }
  return;
}

Assistant:

static void desc_obj_fake(int k_idx)
{
	struct object_kind *kind = &k_info[k_idx];
	struct object_kind *old_kind = player->upkeep->object_kind;
	struct object *old_obj = player->upkeep->object;
	struct object *obj = object_new(), *known_obj = object_new();

	char header[120];

	textblock *tb;
	region area = { 0, 0, 0, 0 };

	/* Update the object recall window */
	track_object_kind(player->upkeep, kind);
	handle_stuff(player);

	/* Create the artifact */
	object_prep(obj, kind, 0, EXTREMIFY);

	/* It's fully known */
	if (kind->aware || !kind->flavor)
		object_copy(known_obj, obj);
	obj->known = known_obj;

	/* Hack -- Handle stuff */
	handle_stuff(player);

	tb = object_info(obj, OINFO_FAKE);
	object_desc(header, sizeof(header), obj,
		ODESC_PREFIX | ODESC_CAPITAL, player);

	textui_textblock_show(tb, area, header);
	object_delete(NULL, NULL, &known_obj);
	object_delete(NULL, NULL, &obj);
	textblock_free(tb);

	/* Restore the old trackee */
	if (old_kind)
		track_object_kind(player->upkeep, old_kind);
	else if (old_obj)
		track_object(player->upkeep, old_obj);
	else
		track_object_cancel(player->upkeep);
}